

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O1

int MetadataMultilayerEncodeTest_Test_Test::AddToRegistry(void)

{
  pointer psVar1;
  pointer psVar2;
  UnitTest *this;
  ParameterizedTestSuiteRegistry *this_00;
  ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest> *pPVar3;
  _Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  _Var4;
  element_type *peVar5;
  char *pcVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  ulong uVar8;
  pointer psVar9;
  pointer psVar10;
  CodeLocation *code_location;
  pointer psVar11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar12;
  ulong uVar13;
  size_type __dnew;
  undefined1 *local_f0;
  long local_e8;
  undefined1 local_e0 [16];
  undefined1 *local_d0;
  long local_c8;
  undefined1 local_c0 [16];
  int local_b0;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  int local_88;
  _func_int *local_80;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  undefined4 local_38;
  
  this = testing::UnitTest::GetInstance();
  this_00 = testing::UnitTest::parameterized_test_registry(this);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>((string *)local_58,local_78,local_78 + local_70);
  local_38 = 0x185;
  pPVar3 = testing::internal::ParameterizedTestSuiteRegistry::
           GetTestSuitePatternHolder<(anonymous_namespace)::MetadataMultilayerEncodeTest>
                     (this_00,(char *)local_58,code_location);
  _Var4.
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
  ._M_head_impl =
       (_Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
        )operator_new(8);
  *(undefined ***)
   _Var4.
   super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
   ._M_head_impl = &PTR__TestMetaFactoryBase_010acf08;
  local_f0 = local_e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/metadata_test.cc"
             ,"");
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_f0,local_f0 + local_e8);
  local_b0 = 0x185;
  peVar5 = (element_type *)operator_new(0x70);
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a8,local_d0,local_d0 + local_c8);
  local_88 = local_b0;
  (peVar5->test_suite_base_name)._M_dataplus._M_p = (pointer)&(peVar5->test_suite_base_name).field_2
  ;
  local_80 = (_func_int *)0x1c;
  pcVar6 = (char *)std::__cxx11::string::_M_create((ulong *)peVar5,(ulong)&local_80);
  (peVar5->test_suite_base_name)._M_dataplus._M_p = pcVar6;
  (peVar5->test_suite_base_name).field_2._M_allocated_capacity = (size_type)local_80;
  builtin_strncpy(pcVar6,"MetadataMultilayerEncodeTest",0x1c);
  (peVar5->test_suite_base_name)._M_string_length = (size_type)local_80;
  local_80[(long)(peVar5->test_suite_base_name)._M_dataplus._M_p] = (_func_int)0x0;
  (peVar5->test_base_name)._M_dataplus._M_p = (pointer)&(peVar5->test_base_name).field_2;
  *(undefined4 *)&(peVar5->test_base_name).field_2 = 0x74736554;
  (peVar5->test_base_name)._M_string_length = 4;
  (peVar5->test_base_name).field_2._M_local_buf[4] = '\0';
  (peVar5->test_meta_factory)._M_t.
  super___uniq_ptr_impl<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_>_>
  .
  super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
       = _Var4.
         super__Head_base<0UL,_testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_libaom_test::TestMode>_>_*,_false>
         ._M_head_impl;
  (peVar5->code_location).file._M_dataplus._M_p = (pointer)&(peVar5->code_location).file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&peVar5->code_location,local_a8,local_a8 + local_a0);
  (peVar5->code_location).line = local_88;
  p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  p_Var7->_M_use_count = 1;
  p_Var7->_M_weak_count = 1;
  p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_010accf0;
  p_Var7[1]._vptr__Sp_counted_base = (_func_int **)peVar5;
  psVar1 = (pPVar3->tests_).
           super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar1 == (pPVar3->tests_).
                super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    psVar2 = (pPVar3->tests_).
             super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((long)psVar1 - (long)psVar2 == 0x7ffffffffffffff0) {
      std::__throw_length_error("vector::_M_realloc_insert");
    }
    uVar13 = (long)psVar1 - (long)psVar2 >> 4;
    uVar8 = 1;
    if (psVar1 != psVar2) {
      uVar8 = uVar13;
    }
    uVar12 = uVar8 + uVar13;
    if (0x7fffffffffffffe < uVar12) {
      uVar12 = 0x7ffffffffffffff;
    }
    if (CARRY8(uVar8,uVar13)) {
      uVar12 = 0x7ffffffffffffff;
    }
    if (uVar12 == 0) {
      psVar9 = (pointer)0x0;
    }
    else {
      psVar9 = (pointer)operator_new(uVar12 << 4);
    }
    psVar9[uVar13].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = peVar5;
    psVar9[uVar13].
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = p_Var7;
    psVar11 = psVar9;
    for (psVar10 = psVar2; psVar1 != psVar10; psVar10 = psVar10 + 1) {
      (psVar11->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      peVar5 = (psVar10->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      p_Var7 = (psVar10->
               super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (psVar11->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = peVar5;
      (psVar11->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_refcount._M_pi = p_Var7;
      (psVar10->
      super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
      )._M_ptr = (element_type *)0x0;
      psVar11 = psVar11 + 1;
    }
    if (psVar2 != (pointer)0x0) {
      operator_delete(psVar2);
    }
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = psVar9;
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar11 + 1;
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar9 + uVar12;
  }
  else {
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_ptr = peVar5;
    (psVar1->
    super___shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo,_(__gnu_cxx::_Lock_policy)2>
    )._M_refcount._M_pi = p_Var7;
    (pPVar3->tests_).
    super__Vector_base<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>,_std::allocator<std::shared_ptr<testing::internal::ParameterizedTestSuiteInfo<(anonymous_namespace)::MetadataMultilayerEncodeTest>::TestInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = psVar1 + 1;
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  if (local_d0 != local_c0) {
    operator_delete(local_d0);
  }
  if (local_f0 != local_e0) {
    operator_delete(local_f0);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return 0;
}

Assistant:

TEST_P(MetadataMultilayerEncodeTest, Test) {
  cfg_.rc_buf_initial_sz = 500;
  cfg_.rc_buf_optimal_sz = 500;
  cfg_.rc_buf_sz = 1000;
  cfg_.g_lag_in_frames = 0;
  cfg_.g_error_resilient = 0;
  cfg_.rc_target_bitrate = 1200;

  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, /*limit=*/10);
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}